

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

bool psy::C::isDiagnosticDescriptorIdOfSyntaxAmbiguity(string *id)

{
  __type _Var1;
  __type local_11;
  string *id_local;
  
  _Var1 = std::operator==(id,&Parser::DiagnosticsReporter::
                              ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_);
  local_11 = true;
  if (!_Var1) {
    _Var1 = std::operator==(id,&Parser::DiagnosticsReporter::
                                ID_of_AmbiguousExpressionOrDeclarationStatement_abi_cxx11_);
    local_11 = true;
    if (!_Var1) {
      local_11 = std::operator==(id,&Parser::DiagnosticsReporter::
                                     ID_of_AmbiguousTypeNameOrExpressionAsTypeReference_abi_cxx11_);
    }
  }
  return local_11;
}

Assistant:

bool isDiagnosticDescriptorIdOfSyntaxAmbiguity(const std::string& id)
{
    return id == Parser::DiagnosticsReporter::ID_of_AmbiguousCastOrBinaryExpression
            || id == Parser::DiagnosticsReporter::ID_of_AmbiguousExpressionOrDeclarationStatement
            || id == Parser::DiagnosticsReporter::ID_of_AmbiguousTypeNameOrExpressionAsTypeReference;
}